

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O1

void __thiscall
Refal2::
CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::~CDictionary(CDictionary<std::shared_ptr<Refal2::CRuntimeFunction>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *this)

{
  Empty(this);
  this->capacity = 0;
  operator_delete(this->keyDataPairs);
  this->keyDataPairs = (CKeyDataPair *)0x0;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->keyToIndex)._M_t);
  return;
}

Assistant:

~CDictionary() { Free(); }